

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::FmtToString>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  string *psVar1;
  EVP_PKEY_CTX *ctx_00;
  StringWriter *this;
  StringWriter writer;
  Options *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  Options *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  StringWriter *in_stack_ffffffffffffff30;
  Options *in_stack_ffffffffffffff38;
  FileOptions local_c0;
  string local_98 [32];
  string local_78 [32];
  uchar local_58 [72];
  Options *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_10 = (Options *)sig;
  local_8 = ctx;
  Options::scrub(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  Options::fileOptions(in_stack_ffffffffffffff38);
  psVar1 = Options::FileOptions::getFileExtension_abi_cxx11_(&local_c0);
  ::std::__cxx11::string::string(local_98,(string *)psVar1);
  StringWriter::StringWriter
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  ::std::__cxx11::string::~string(local_98);
  Options::FileOptions::~FileOptions((FileOptions *)0x13c6ca);
  ::std::__cxx11::string::~string(local_78);
  Options::getNamer(in_stack_ffffffffffffff08);
  ctx_00 = (EVP_PKEY_CTX *)
           ::std::
           __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff10);
  this = (StringWriter *)Options::getReporter(local_10);
  FileApprover::verify(ctx_00,local_58,(size_t)this,tbs,tbslen);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x13c72f);
  StringWriter::~StringWriter(this);
  return extraout_EAX;
}

Assistant:

static void verify(const std::string& contents,
                           const Options& options = Options())
        {
            StringWriter writer(options.scrub(contents),
                                options.fileOptions().getFileExtension());
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }